

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall iqnet::Reactor<iqnet::Null_lock>::Reactor(Reactor<iqnet::Null_lock> *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Reactor_base)._vptr_Reactor_base = (_func_int **)&PTR__Reactor_0019c1f8;
  Reactor_poll_impl::Reactor_poll_impl(&this->impl);
  p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
  (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->handlers_states).
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->handlers_states;
  (this->handlers_states).
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->handlers_states;
  (this->handlers_states).
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node._M_size = 0;
  this->num_stoppers = 0;
  return;
}

Assistant:

Reactor<Lock>::Reactor():
  num_stoppers(0)
{
}